

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void __thiscall deqp::egl::RenderTestThread::run(RenderTestThread *this)

{
  EGLint api;
  Functions *gl;
  Program *program;
  bool bVar1;
  deUint32 dVar2;
  deBool dVar3;
  pointer pDVar4;
  Semaphore *pSVar5;
  int local_24;
  const_iterator cStack_20;
  int ndx;
  __normal_iterator<const_deqp::egl::DrawOpPacket_*,_std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
  local_18;
  const_iterator packetIter;
  RenderTestThread *this_local;
  
  packetIter._M_current = (DrawOpPacket *)this;
  local_18._M_current =
       (DrawOpPacket *)
       std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::begin
                 (this->m_packets);
  while( true ) {
    cStack_20 = std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>::end
                          (this->m_packets);
    bVar1 = __gnu_cxx::operator!=(&local_18,&stack0xffffffffffffffe0);
    if (!bVar1) break;
    pDVar4 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::DrawOpPacket_*,_std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
             ::operator->(&local_18);
    pSVar5 = de::SharedPtr<de::Semaphore>::operator->(&pDVar4->wait);
    de::Semaphore::decrement(pSVar5);
    do {
      (*this->m_egl->_vptr_Library[0x27])
                (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
      dVar2 = (*this->m_egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,"makeCurrent(m_display, m_surface, m_surface, m_context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x359);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    local_24 = 0;
    while( true ) {
      pDVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::egl::DrawOpPacket_*,_std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
               ::operator->(&local_18);
      if (pDVar4->numOps <= local_24) break;
      gl = this->m_gl;
      api = this->m_api;
      program = this->m_program;
      pDVar4 = __gnu_cxx::
               __normal_iterator<const_deqp::egl::DrawOpPacket_*,_std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
               ::operator->(&local_18);
      anon_unknown_4::draw(gl,api,program,pDVar4->drawOps + local_24);
      local_24 = local_24 + 1;
    }
    anon_unknown_4::finish(this->m_gl,this->m_api);
    do {
      (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0);
      dVar2 = (*this->m_egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar2,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x362);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pDVar4 = __gnu_cxx::
             __normal_iterator<const_deqp::egl::DrawOpPacket_*,_std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
             ::operator->(&local_18);
    pSVar5 = de::SharedPtr<de::Semaphore>::operator->(&pDVar4->signal);
    de::Semaphore::increment(pSVar5);
    __gnu_cxx::
    __normal_iterator<const_deqp::egl::DrawOpPacket_*,_std::vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>_>
    ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<DrawOpPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			EGLU_CHECK_CALL(m_egl, makeCurrent(m_display, m_surface, m_surface, m_context));

			// Execute rendering.
			for (int ndx = 0; ndx < packetIter->numOps; ndx++)
				draw(m_gl, m_api, m_program, packetIter->drawOps[ndx]);

			finish(m_gl, m_api);

			// Release context.
			EGLU_CHECK_CALL(m_egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

			// Signal completion.
			packetIter->signal->increment();
		}
	}